

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

void __thiscall
glcts::anon_unknown_0::UniformType::UniformType(UniformType *this,UniformType *param_1)

{
  pair<int,_int> pVar1;
  pointer piVar2;
  pointer pUVar3;
  
  this->enumType = param_1->enumType;
  piVar2 = (param_1->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = piVar2;
  (this->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_1->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->arraySize = param_1->arraySize;
  pUVar3 = (param_1->childTypes).
           super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->childTypes).
  super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->childTypes).
       super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->childTypes).
  super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ._M_impl.super__Vector_impl_data._M_finish = pUVar3;
  (this->childTypes).
  super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->childTypes).
       super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->childTypes).
  super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->childTypes).
  super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->childTypes).
  super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::string((string *)&this->strType,(string *)&param_1->strType);
  std::__cxx11::string::string((string *)&this->refStrType,(string *)&param_1->refStrType);
  pVar1 = param_1->size;
  *(undefined8 *)((long)&(this->size).second + 2) =
       *(undefined8 *)((long)&(param_1->size).second + 2);
  this->size = pVar1;
  return;
}

Assistant:

UniformType(GLenum _enumType, int _arraySize = 0)
		: enumType(_enumType), arraySize(_arraySize), isArray(_arraySize > 0), signedType(true)
	{
		if (!arraySize)
		{
			arraySize = 1;
		}
		arraySizesSegmented.push_back(arraySize);
		fill();
	}